

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_CreateStringReference(char *string)

{
  cJSON *pcVar1;
  
  pcVar1 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (pcVar1 != (cJSON *)0x0) {
    pcVar1->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar1->type = 0;
    pcVar1->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar1->valueint = 0;
    pcVar1->valuedouble = 0.0;
    pcVar1->string = (char *)0x0;
    pcVar1->next = (cJSON *)0x0;
    pcVar1->prev = (cJSON *)0x0;
    pcVar1->type = 0x110;
    pcVar1->valuestring = string;
  }
  return pcVar1;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateStringReference(const char *string)
{
    cJSON *item = cJSON_New_Item(&global_hooks);
    if (item != NULL)
    {
        item->type = cJSON_String | cJSON_IsReference;
        item->valuestring = (char*)cast_away_const(string);
    }

    return item;
}